

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<std::complex<double>,_10>::Resize
          (TPZManVector<std::complex<double>,_10> *this,int64_t newsize,complex<double> *object)

{
  undefined1 auVar1 [16];
  ostream *this_00;
  ulong uVar2;
  ulong uVar3;
  complex<double> *pcVar4;
  complex<double> *pcVar5;
  undefined8 *in_RDX;
  long in_RSI;
  TPZManVector<std::complex<double>,_10> *in_RDI;
  complex<double> *newstore;
  int64_t realsize;
  int64_t i_2;
  int64_t i_1;
  int64_t i;
  complex<double> *local_80;
  long local_30;
  long local_28;
  long local_20;
  
  if (in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  else if (in_RSI != (in_RDI->super_TPZVec<std::complex<double>_>).fNElements) {
    if ((in_RDI->super_TPZVec<std::complex<double>_>).fNAlloc < in_RSI) {
      if (in_RSI < 0xb) {
        for (local_28 = 0; local_28 < (in_RDI->super_TPZVec<std::complex<double>_>).fNElements;
            local_28 = local_28 + 1) {
          pcVar4 = (in_RDI->super_TPZVec<std::complex<double>_>).fStore + local_28;
          *(undefined8 *)in_RDI->fExtAlloc[local_28]._M_value = *(undefined8 *)pcVar4->_M_value;
          *(undefined8 *)(in_RDI->fExtAlloc[local_28]._M_value + 8) =
               *(undefined8 *)(pcVar4->_M_value + 8);
        }
        for (; local_28 < in_RSI; local_28 = local_28 + 1) {
          *(undefined8 *)in_RDI->fExtAlloc[local_28]._M_value = *in_RDX;
          *(undefined8 *)(in_RDI->fExtAlloc[local_28]._M_value + 8) = in_RDX[1];
        }
        if (((in_RDI->super_TPZVec<std::complex<double>_>).fStore != in_RDI->fExtAlloc) &&
           (pcVar4 = (in_RDI->super_TPZVec<std::complex<double>_>).fStore,
           pcVar4 != (complex<double> *)0x0)) {
          operator_delete__(pcVar4);
        }
        (in_RDI->super_TPZVec<std::complex<double>_>).fStore = in_RDI->fExtAlloc;
        (in_RDI->super_TPZVec<std::complex<double>_>).fNElements = in_RSI;
        (in_RDI->super_TPZVec<std::complex<double>_>).fNAlloc = 10;
      }
      else {
        uVar2 = ExpandSize(in_RDI,in_RSI);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar2;
        uVar3 = SUB168(auVar1 * ZEXT816(0x10),0);
        if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
          uVar3 = 0xffffffffffffffff;
        }
        pcVar4 = (complex<double> *)operator_new__(uVar3);
        if (uVar2 != 0) {
          local_80 = pcVar4;
          do {
            std::complex<double>::complex(local_80,0.0,0.0);
            local_80 = local_80 + 1;
          } while (local_80 != pcVar4 + uVar2);
        }
        for (local_30 = 0; local_30 < (in_RDI->super_TPZVec<std::complex<double>_>).fNElements;
            local_30 = local_30 + 1) {
          pcVar5 = (in_RDI->super_TPZVec<std::complex<double>_>).fStore + local_30;
          *(undefined8 *)pcVar4[local_30]._M_value = *(undefined8 *)pcVar5->_M_value;
          *(undefined8 *)((long)pcVar4[local_30]._M_value + 8) =
               *(undefined8 *)(pcVar5->_M_value + 8);
        }
        for (; local_30 < in_RSI; local_30 = local_30 + 1) {
          *(undefined8 *)pcVar4[local_30]._M_value = *in_RDX;
          *(undefined8 *)((long)pcVar4[local_30]._M_value + 8) = in_RDX[1];
        }
        if (((in_RDI->super_TPZVec<std::complex<double>_>).fStore != in_RDI->fExtAlloc) &&
           (pcVar5 = (in_RDI->super_TPZVec<std::complex<double>_>).fStore,
           pcVar5 != (complex<double> *)0x0)) {
          operator_delete__(pcVar5);
        }
        (in_RDI->super_TPZVec<std::complex<double>_>).fStore = pcVar4;
        (in_RDI->super_TPZVec<std::complex<double>_>).fNElements = in_RSI;
        (in_RDI->super_TPZVec<std::complex<double>_>).fNAlloc = uVar2;
      }
    }
    else {
      for (local_20 = (in_RDI->super_TPZVec<std::complex<double>_>).fNElements; local_20 < in_RSI;
          local_20 = local_20 + 1) {
        pcVar4 = (in_RDI->super_TPZVec<std::complex<double>_>).fStore + local_20;
        *(undefined8 *)pcVar4->_M_value = *in_RDX;
        *(undefined8 *)(pcVar4->_M_value + 8) = in_RDX[1];
      }
      (in_RDI->super_TPZVec<std::complex<double>_>).fNElements = in_RSI;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}